

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

bool __thiscall xLearn::InmemReader::hash_binary(InmemReader *this,string *filename)

{
  pointer pcVar1;
  uint64_t uVar2;
  bool bVar3;
  FILE *file;
  uint64_t uVar4;
  uint64 hash_2;
  uint64 hash_1;
  string bin_file;
  uint64_t local_50;
  uint64_t local_48;
  char *local_40 [2];
  char local_30 [16];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + filename->_M_string_length);
  std::__cxx11::string::append((char *)local_40);
  bVar3 = FileExist(local_40[0]);
  if (bVar3) {
    file = OpenFileOrDie(local_40[0],"r");
    local_48 = 0;
    ReadDataFromDisk(file,(char *)&local_48,8);
    uVar2 = local_48;
    uVar4 = HashFile(filename,true);
    if (uVar2 == uVar4) {
      local_50 = 0;
      ReadDataFromDisk(file,(char *)&local_50,8);
      uVar2 = local_50;
      uVar4 = HashFile(filename,false);
      Close(file);
      bVar3 = uVar2 == uVar4;
      goto LAB_0013b3ba;
    }
    Close(file);
  }
  bVar3 = false;
LAB_0013b3ba:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return bVar3;
}

Assistant:

bool InmemReader::hash_binary(const std::string& filename) {
  std::string bin_file = filename + ".bin";
  // If the ".bin" file does not exists, return false.
  if (!FileExist(bin_file.c_str())) { return false; }
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(bin_file.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(bin_file.c_str(), "rb");
#endif
  // Check the first hash value
  uint64 hash_1 = 0;
  ReadDataFromDisk(file, (char*)&hash_1, sizeof(hash_1));
  if (hash_1 != HashFile(filename, true)) {
    Close(file);
    return false;
  }
  // Check the second hash value
  uint64 hash_2 = 0;
  ReadDataFromDisk(file, (char*)&hash_2, sizeof(hash_2));
  if (hash_2 != HashFile(filename, false)) {
    Close(file);
    return false;
  }
  Close(file);
  return true;
}